

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minTemp3_fast_iVar5(uint *pInOut,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  long lVar1;
  int iVar2;
  
  if (finish < start) {
    lVar1 = (long)(start + -1);
    do {
      iVar2 = -(uint)(pInOut[lVar1 - iQ] < pInOut[lVar1 - jQ]);
      if (pInOut[lVar1 - jQ] < pInOut[lVar1 - iQ]) {
        iVar2 = 1;
      }
      if (iVar2 != 0) {
        if (iVar2 == -1) goto LAB_005dee56;
        iVar2 = 1;
        goto LAB_005dee60;
      }
      lVar1 = lVar1 + -4;
      start = start + -4;
    } while (finish <= lVar1);
    start = 0;
LAB_005dee56:
    iVar2 = 0;
  }
  else {
    start = 0;
    iVar2 = 0;
  }
LAB_005dee60:
  *pDifStart = start;
  return iVar2;
}

Assistant:

int minTemp3_fast_iVar5(unsigned* pInOut, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, temp;
//     printf("in minTemp3_fast_iVar5\n");

    for(i=start-1; i>=finish; i-=4) 
    {
        temp = CompareWords(pInOut[i-iQ],pInOut[i-jQ]);
        if(temp == 0)
            continue;
        else if(temp == -1)
        {
            *pDifStart = i+1;
            return 0;
        }
        else
        {
            *pDifStart = i+1;
            return 1;
        }
    }
    *pDifStart=0;
    return 0;
}